

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aescrypt2.c
# Opt level: O3

int main(int argc,char **argv)

{
  char **ppcVar1;
  int *__s;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  mbedtls_md_info_t *md_info;
  FILE *pFVar5;
  FILE *__stream;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  uchar *puVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  undefined1 auVar13 [16];
  uint n;
  mbedtls_md_context_t sha_ctx;
  mbedtls_aes_context aes_ctx;
  uchar buffer [1024];
  uchar key [512];
  uint local_7ec;
  uint local_7e8;
  uint local_7e4;
  FILE *local_7e0;
  ulong local_7d8;
  FILE *local_7d0;
  undefined1 local_7c8 [16];
  char **local_7b8;
  mbedtls_md_context_t local_7b0;
  undefined1 local_798 [16];
  undefined1 local_788 [16];
  size_t local_770;
  undefined8 local_768;
  undefined8 uStack_760;
  mbedtls_aes_context local_758;
  uchar local_638 [4];
  char cStack_634;
  char cStack_633;
  char cStack_632;
  char cStack_631;
  char cStack_630;
  char cStack_62f;
  char cStack_62e;
  char cStack_62d;
  char cStack_62c;
  char cStack_62b;
  char cStack_62a;
  byte bStack_629;
  char local_628;
  char cStack_627;
  char cStack_626;
  char cStack_625;
  char cStack_624;
  char cStack_623;
  char cStack_622;
  char cStack_621;
  char cStack_620;
  char cStack_61f;
  char cStack_61e;
  char cStack_61d;
  char cStack_61c;
  char cStack_61b;
  char cStack_61a;
  char cStack_619;
  uchar local_238 [520];
  
  mbedtls_aes_init(&local_758);
  mbedtls_md_init(&local_7b0);
  md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
  iVar3 = mbedtls_md_setup(&local_7b0,md_info,1);
  if (iVar3 == 0) {
    if (argc != 5) {
      puts(
          "\n  aescrypt2 <mode> <input filename> <output filename> <key>\n\n   <mode>: 0 = encrypt, 1 = decrypt\n\n  example: aescrypt2 0 file file.aes hex:E76B2413958B00E193\n"
          );
      iVar3 = 0;
      goto LAB_00103b49;
    }
    local_7e8 = argc;
    uVar4 = atoi(argv[1]);
    local_7c8 = (undefined1  [16])0x0;
    memset(local_238,0,0x200);
    local_798 = (undefined1  [16])0x0;
    local_788 = (undefined1  [16])0x0;
    puVar9 = local_638;
    memset(puVar9,0,0x400);
    local_7e4 = uVar4;
    if (uVar4 < 2) {
      pcVar2 = argv[2];
      iVar3 = strcmp(pcVar2,argv[3]);
      if (iVar3 == 0) {
        main_cold_13();
      }
      else {
        ppcVar1 = argv + 2;
        pFVar5 = fopen(pcVar2,"rb");
        if (pFVar5 == (FILE *)0x0) {
          main_cold_12();
        }
        else {
          local_7d0 = fopen(argv[3],"wb+");
          if (local_7d0 != (FILE *)0x0) {
            __stream = fopen(argv[4],"rb");
            local_7e0 = pFVar5;
            local_7b8 = ppcVar1;
            if (__stream == (FILE *)0x0) {
              __s = (int *)argv[4];
              if (*__s == 0x3a786568) {
                iVar3 = __isoc99_sscanf(__s + 1,"%02X",&local_7ec);
                if (iVar3 < 1) {
                  sVar7 = 0;
                }
                else {
                  lVar8 = (long)__s + 6;
                  uVar11 = 0;
                  do {
                    sVar7 = uVar11 + 1;
                    local_238[uVar11] = (uchar)local_7ec;
                    iVar3 = __isoc99_sscanf(lVar8,"%02X",&local_7ec);
                    if (iVar3 < 1) break;
                    lVar8 = lVar8 + 2;
                    bVar12 = uVar11 < 0x1ff;
                    uVar11 = sVar7;
                  } while (bVar12);
                }
              }
              else {
                sVar6 = strlen((char *)__s);
                sVar7 = 0x200;
                if (sVar6 < 0x200) {
                  sVar7 = sVar6;
                }
                memcpy(local_238,__s,sVar7);
              }
            }
            else {
              sVar7 = fread(local_238,1,0x200,__stream);
              fclose(__stream);
            }
            pFVar5 = local_7e0;
            local_770 = sVar7;
            iVar3 = fileno(local_7e0);
            uVar11 = lseek(iVar3,0,2);
            if ((long)uVar11 < 0) {
              perror("lseek");
            }
            else {
              iVar3 = fseek(pFVar5,0,0);
              if (iVar3 < 0) {
                main_cold_10();
              }
              else {
                local_7d8 = uVar11;
                if ((local_7e4 & 1) == 0) {
                  lVar8 = 0;
                  do {
                    *puVar9 = (uchar)(uVar11 >> ((byte)lVar8 & 0x3f));
                    puVar9 = puVar9 + 1;
                    lVar8 = lVar8 + 8;
                  } while (lVar8 != 0x40);
                  puVar9 = (uchar *)*local_7b8;
                  mbedtls_md_starts(&local_7b0);
                  mbedtls_md_update(&local_7b0,local_638,8);
                  sVar7 = strlen((char *)puVar9);
                  mbedtls_md_update(&local_7b0,puVar9,sVar7);
                  mbedtls_md_finish(&local_7b0,local_798);
                  local_7c8[0xf] = local_798[0xf];
                  local_7c8._0_15_ = local_798._0_15_;
                  local_7c8[0xf] = local_7c8[0xf] & 0xf0 | (byte)uVar11 & 0xf;
                  sVar6 = fwrite(local_7c8,1,0x10,local_7d0);
                  sVar7 = local_770;
                  if (sVar6 == 0x10) {
                    local_788 = (undefined1  [16])0x0;
                    local_798 = local_7c8;
                    iVar3 = 0x2000;
                    do {
                      mbedtls_md_starts(&local_7b0);
                      mbedtls_md_update(&local_7b0,local_798,0x20);
                      mbedtls_md_update(&local_7b0,local_238,sVar7);
                      mbedtls_md_finish(&local_7b0,local_798);
                      iVar3 = iVar3 + -1;
                    } while (iVar3 != 0);
                    mbedtls_aes_setkey_enc(&local_758,local_798,0x100);
                    mbedtls_md_hmac_starts(&local_7b0,local_798,0x20);
                    pFVar5 = local_7e0;
                    if (local_7d8 != 0) {
                      lVar8 = 0;
                      uVar11 = local_7d8;
                      do {
                        local_7ec = 0x10;
                        if ((long)uVar11 < 0x10) {
                          local_7ec = (uint)uVar11;
                        }
                        sVar7 = fread(local_638,1,(ulong)local_7ec,pFVar5);
                        if (sVar7 != local_7ec) {
                          fprintf(_stderr,"fread(%d bytes) failed\n");
                          goto LAB_00103b30;
                        }
                        uVar4 = local_7c8._0_4_ ^
                                CONCAT13(local_638[3],
                                         CONCAT12(local_638[2],CONCAT11(local_638[1],local_638[0])))
                        ;
                        uVar14 = local_7c8._4_4_ ^
                                 CONCAT13(cStack_631,
                                          CONCAT12(cStack_632,CONCAT11(cStack_633,cStack_634)));
                        uVar15 = local_7c8._8_4_ ^
                                 CONCAT13(cStack_62d,
                                          CONCAT12(cStack_62e,CONCAT11(cStack_62f,cStack_630)));
                        uVar16 = local_7c8._12_4_ ^
                                 CONCAT13(bStack_629,
                                          CONCAT12(cStack_62a,CONCAT11(cStack_62b,cStack_62c)));
                        local_638[0] = (uchar)uVar4;
                        local_638[1] = (uchar)(uVar4 >> 8);
                        local_638[2] = (uchar)(uVar4 >> 0x10);
                        local_638[3] = (uchar)(uVar4 >> 0x18);
                        cStack_634 = (char)uVar14;
                        cStack_633 = (char)(uVar14 >> 8);
                        cStack_632 = (char)(uVar14 >> 0x10);
                        cStack_631 = (char)(uVar14 >> 0x18);
                        cStack_630 = (char)uVar15;
                        cStack_62f = (char)(uVar15 >> 8);
                        cStack_62e = (char)(uVar15 >> 0x10);
                        cStack_62d = (char)(uVar15 >> 0x18);
                        cStack_62c = (char)uVar16;
                        cStack_62b = (char)(uVar16 >> 8);
                        cStack_62a = (char)(uVar16 >> 0x10);
                        bStack_629 = (byte)(uVar16 >> 0x18);
                        mbedtls_aes_crypt_ecb(&local_758,1,local_638,local_638);
                        mbedtls_md_hmac_update(&local_7b0,local_638,0x10);
                        sVar7 = fwrite(local_638,1,0x10,local_7d0);
                        if (sVar7 != 0x10) {
                          main_cold_2();
                          goto LAB_00103b30;
                        }
                        local_7c8[1] = local_638[1];
                        local_7c8[0] = local_638[0];
                        local_7c8[2] = local_638[2];
                        local_7c8[3] = local_638[3];
                        local_7c8[4] = cStack_634;
                        local_7c8[5] = cStack_633;
                        local_7c8[6] = cStack_632;
                        local_7c8[7] = cStack_631;
                        local_7c8[9] = cStack_62f;
                        local_7c8[8] = cStack_630;
                        local_7c8[10] = cStack_62e;
                        local_7c8[0xb] = cStack_62d;
                        local_7c8[0xc] = cStack_62c;
                        local_7c8[0xd] = cStack_62b;
                        local_7c8[0xe] = cStack_62a;
                        local_7c8[0xf] = bStack_629;
                        lVar8 = lVar8 + 0x10;
                        uVar11 = uVar11 - 0x10;
                      } while (lVar8 < (long)local_7d8);
                    }
                    mbedtls_md_hmac_finish(&local_7b0,local_798);
                    sVar7 = fwrite(local_798,1,0x20,local_7d0);
                    if (sVar7 == 0x20) {
                      if (local_7e4 == 1) goto LAB_001038e9;
                    }
                    else {
                      main_cold_3();
                    }
                  }
                  else {
                    main_cold_1();
                  }
                }
                else {
LAB_001038e9:
                  uVar11 = local_7d8;
                  if ((long)local_7d8 < 0x30) {
                    main_cold_9();
                  }
                  else if ((local_7d8 & 0xf) == 0) {
                    sVar6 = fread(local_638,1,0x10,pFVar5);
                    sVar7 = local_770;
                    if (sVar6 == 0x10) {
                      local_7b8 = (char **)(uVar11 - 0x30);
                      local_7c8._0_8_ =
                           CONCAT17(cStack_631,
                                    CONCAT16(cStack_632,
                                             CONCAT15(cStack_633,
                                                      CONCAT14(cStack_634,
                                                               CONCAT13(local_638[3],
                                                                        CONCAT12(local_638[2],
                                                                                 CONCAT11(local_638[
                                                  1],local_638[0])))))));
                      local_7c8._8_8_ =
                           CONCAT17(bStack_629,
                                    CONCAT16(cStack_62a,
                                             CONCAT15(cStack_62b,
                                                      CONCAT14(cStack_62c,
                                                               CONCAT13(cStack_62d,
                                                                        CONCAT12(cStack_62e,
                                                                                 CONCAT11(cStack_62f
                                                                                          ,
                                                  cStack_630)))))));
                      local_7e4 = bStack_629 & 0xf;
                      local_788 = (undefined1  [16])0x0;
                      local_798._8_8_ = local_7c8._8_8_;
                      local_798._0_8_ = local_7c8._0_8_;
                      iVar3 = 0x2000;
                      do {
                        mbedtls_md_starts(&local_7b0);
                        mbedtls_md_update(&local_7b0,local_798,0x20);
                        mbedtls_md_update(&local_7b0,local_238,sVar7);
                        mbedtls_md_finish(&local_7b0,local_798);
                        iVar3 = iVar3 + -1;
                      } while (iVar3 != 0);
                      mbedtls_aes_setkey_dec(&local_758,local_798,0x100);
                      mbedtls_md_hmac_starts(&local_7b0,local_798,0x20);
                      if (local_7d8 != 0x30) {
                        lVar10 = local_7d8 - 0x40;
                        lVar8 = 0;
                        do {
                          sVar7 = fread(local_638,1,0x10,local_7e0);
                          if (sVar7 != 0x10) {
                            main_cold_6();
                            pFVar5 = local_7e0;
                            goto LAB_00103b30;
                          }
                          local_768 = CONCAT17(cStack_631,
                                               CONCAT16(cStack_632,
                                                        CONCAT15(cStack_633,
                                                                 CONCAT14(cStack_634,
                                                                          CONCAT13(local_638[3],
                                                                                   CONCAT12(
                                                  local_638[2],CONCAT11(local_638[1],local_638[0])))
                                                  ))));
                          uStack_760 = CONCAT17(bStack_629,
                                                CONCAT16(cStack_62a,
                                                         CONCAT15(cStack_62b,
                                                                  CONCAT14(cStack_62c,
                                                                           CONCAT13(cStack_62d,
                                                                                    CONCAT12(
                                                  cStack_62e,CONCAT11(cStack_62f,cStack_630)))))));
                          mbedtls_md_hmac_update(&local_7b0,local_638,0x10);
                          mbedtls_aes_crypt_ecb(&local_758,0,local_638,local_638);
                          uVar4 = 0x10;
                          if (lVar10 == lVar8) {
                            uVar4 = local_7e4;
                          }
                          uVar14 = local_7c8._0_4_ ^
                                   CONCAT13(local_638[3],
                                            CONCAT12(local_638[2],
                                                     CONCAT11(local_638[1],local_638[0])));
                          uVar15 = local_7c8._4_4_ ^
                                   CONCAT13(cStack_631,
                                            CONCAT12(cStack_632,CONCAT11(cStack_633,cStack_634)));
                          uVar16 = local_7c8._8_4_ ^
                                   CONCAT13(cStack_62d,
                                            CONCAT12(cStack_62e,CONCAT11(cStack_62f,cStack_630)));
                          uVar17 = local_7c8._12_4_ ^
                                   CONCAT13(bStack_629,
                                            CONCAT12(cStack_62a,CONCAT11(cStack_62b,cStack_62c)));
                          local_638[0] = (uchar)uVar14;
                          local_638[1] = (uchar)(uVar14 >> 8);
                          local_638[2] = (uchar)(uVar14 >> 0x10);
                          local_638[3] = (uchar)(uVar14 >> 0x18);
                          cStack_634 = (char)uVar15;
                          cStack_633 = (char)(uVar15 >> 8);
                          cStack_632 = (char)(uVar15 >> 0x10);
                          cStack_631 = (char)(uVar15 >> 0x18);
                          cStack_630 = (char)uVar16;
                          cStack_62f = (char)(uVar16 >> 8);
                          cStack_62e = (char)(uVar16 >> 0x10);
                          cStack_62d = (char)(uVar16 >> 0x18);
                          cStack_62c = (char)uVar17;
                          cStack_62b = (char)(uVar17 >> 8);
                          cStack_62a = (char)(uVar17 >> 0x10);
                          bStack_629 = (byte)(uVar17 >> 0x18);
                          local_7c8._8_8_ = uStack_760;
                          local_7c8._0_8_ = local_768;
                          sVar7 = (size_t)uVar4;
                          if ((char)local_7e4 == '\0') {
                            sVar7 = 0x10;
                          }
                          local_7ec = (uint)sVar7;
                          sVar7 = fwrite(local_638,1,sVar7,local_7d0);
                          if (sVar7 != local_7ec) {
                            fprintf(_stderr,"fwrite(%d bytes) failed\n");
                            pFVar5 = local_7e0;
                            goto LAB_00103b30;
                          }
                          lVar8 = lVar8 + 0x10;
                        } while (lVar8 < (long)local_7b8);
                      }
                      mbedtls_md_hmac_finish(&local_7b0,local_798);
                      pFVar5 = local_7e0;
                      sVar7 = fread(local_638,1,0x20,local_7e0);
                      if (sVar7 == 0x20) {
                        auVar13[0] = -(local_628 == local_788[0] && local_638[0] == local_798[0]);
                        auVar13[1] = -(cStack_627 == local_788[1] && local_638[1] == local_798[1]);
                        auVar13[2] = -(cStack_626 == local_788[2] && local_638[2] == local_798[2]);
                        auVar13[3] = -(cStack_625 == local_788[3] && local_638[3] == local_798[3]);
                        auVar13[4] = -(cStack_624 == local_788[4] && cStack_634 == local_798[4]);
                        auVar13[5] = -(cStack_623 == local_788[5] && cStack_633 == local_798[5]);
                        auVar13[6] = -(cStack_622 == local_788[6] && cStack_632 == local_798[6]);
                        auVar13[7] = -(cStack_621 == local_788[7] && cStack_631 == local_798[7]);
                        auVar13[8] = -(cStack_620 == local_788[8] && cStack_630 == local_798[8]);
                        auVar13[9] = -(cStack_61f == local_788[9] && cStack_62f == local_798[9]);
                        auVar13[10] = -(cStack_61e == local_788[10] && cStack_62e == local_798[10]);
                        auVar13[0xb] = -(cStack_61d == local_788[0xb] &&
                                        cStack_62d == local_798[0xb]);
                        auVar13[0xc] = -(cStack_61c == local_788[0xc] &&
                                        cStack_62c == local_798[0xc]);
                        auVar13[0xd] = -(cStack_61b == local_788[0xd] &&
                                        cStack_62b == local_798[0xd]);
                        auVar13[0xe] = -(cStack_61a == local_788[0xe] &&
                                        cStack_62a == local_798[0xe]);
                        auVar13[0xf] = -(cStack_619 == local_788[0xf] &&
                                        bStack_629 == local_798[0xf]);
                        if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(auVar13[0xf] >> 7) << 0xf) != 0xffff) {
                          main_cold_8();
                        }
                      }
                      else {
                        main_cold_7();
                      }
                    }
                    else {
                      main_cold_5();
                    }
                  }
                  else {
                    main_cold_4();
                  }
                }
              }
            }
LAB_00103b30:
            fclose(pFVar5);
            fclose(local_7d0);
            iVar3 = 0;
            argc = local_7e8;
            goto LAB_00103b49;
          }
          main_cold_11();
        }
      }
    }
    else {
      main_cold_14();
    }
    iVar3 = 0;
    argc = local_7e8;
  }
  else {
    printf("  ! mbedtls_md_setup() returned -0x%04x\n");
LAB_00103b49:
    if (argc == 0) goto LAB_00103b74;
  }
  uVar11 = 0;
  do {
    pcVar2 = argv[uVar11];
    sVar7 = strlen(pcVar2);
    memset(pcVar2,0,sVar7);
    uVar11 = uVar11 + 1;
  } while ((uint)argc != uVar11);
LAB_00103b74:
  memset(local_238,0,0x200);
  memset(local_638,0,0x400);
  local_798 = (undefined1  [16])0x0;
  local_788 = (undefined1  [16])0x0;
  mbedtls_aes_free(&local_758);
  mbedtls_md_free(&local_7b0);
  return iVar3;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 1;

    unsigned int i, n;
    int mode, lastn;
    size_t keylen;
    FILE *fkey, *fin = NULL, *fout = NULL;

    char *p;

    unsigned char IV[16];
    unsigned char tmp[16];
    unsigned char key[512];
    unsigned char digest[32];
    unsigned char buffer[1024];
    unsigned char diff;

    mbedtls_aes_context aes_ctx;
    mbedtls_md_context_t sha_ctx;

#if defined(_WIN32_WCE)
    long filesize, offset;
#elif defined(_WIN32)
       LARGE_INTEGER li_size;
    __int64 filesize, offset;
#else
      off_t filesize, offset;
#endif

    mbedtls_aes_init( &aes_ctx );
    mbedtls_md_init( &sha_ctx );

    ret = mbedtls_md_setup( &sha_ctx, mbedtls_md_info_from_type( MBEDTLS_MD_SHA256 ), 1 );
    if( ret != 0 )
    {
        mbedtls_printf( "  ! mbedtls_md_setup() returned -0x%04x\n", -ret );
        goto exit;
    }

    /*
     * Parse the command-line arguments.
     */
    if( argc != 5 )
    {
        mbedtls_printf( USAGE );

#if defined(_WIN32)
        mbedtls_printf( "\n  Press Enter to exit this program.\n" );
        fflush( stdout ); getchar();
#endif

        goto exit;
    }

    mode = atoi( argv[1] );
    memset( IV,     0, sizeof( IV ) );
    memset( key,    0, sizeof( key ) );
    memset( digest, 0, sizeof( digest ) );
    memset( buffer, 0, sizeof( buffer ) );

    if( mode != MODE_ENCRYPT && mode != MODE_DECRYPT )
    {
        mbedtls_fprintf( stderr, "invalide operation mode\n" );
        goto exit;
    }

    if( strcmp( argv[2], argv[3] ) == 0 )
    {
        mbedtls_fprintf( stderr, "input and output filenames must differ\n" );
        goto exit;
    }

    if( ( fin = fopen( argv[2], "rb" ) ) == NULL )
    {
        mbedtls_fprintf( stderr, "fopen(%s,rb) failed\n", argv[2] );
        goto exit;
    }

    if( ( fout = fopen( argv[3], "wb+" ) ) == NULL )
    {
        mbedtls_fprintf( stderr, "fopen(%s,wb+) failed\n", argv[3] );
        goto exit;
    }

    /*
     * Read the secret key from file or command line
     */
    if( ( fkey = fopen( argv[4], "rb" ) ) != NULL )
    {
        keylen = fread( key, 1, sizeof( key ), fkey );
        fclose( fkey );
    }
    else
    {
        if( memcmp( argv[4], "hex:", 4 ) == 0 )
        {
            p = &argv[4][4];
            keylen = 0;

            while( sscanf( p, "%02X", &n ) > 0 &&
                   keylen < (int) sizeof( key ) )
            {
                key[keylen++] = (unsigned char) n;
                p += 2;
            }
        }
        else
        {
            keylen = strlen( argv[4] );

            if( keylen > (int) sizeof( key ) )
                keylen = (int) sizeof( key );

            memcpy( key, argv[4], keylen );
        }
    }

#if defined(_WIN32_WCE)
    filesize = fseek( fin, 0L, SEEK_END );
#else
#if defined(_WIN32)
    /*
     * Support large files (> 2Gb) on Win32
     */
    li_size.QuadPart = 0;
    li_size.LowPart  =
        SetFilePointer( (HANDLE) _get_osfhandle( _fileno( fin ) ),
                        li_size.LowPart, &li_size.HighPart, FILE_END );

    if( li_size.LowPart == 0xFFFFFFFF && GetLastError() != NO_ERROR )
    {
        mbedtls_fprintf( stderr, "SetFilePointer(0,FILE_END) failed\n" );
        goto exit;
    }

    filesize = li_size.QuadPart;
#else
    if( ( filesize = lseek( fileno( fin ), 0, SEEK_END ) ) < 0 )
    {
        perror( "lseek" );
        goto exit;
    }
#endif
#endif

    if( fseek( fin, 0, SEEK_SET ) < 0 )
    {
        mbedtls_fprintf( stderr, "fseek(0,SEEK_SET) failed\n" );
        goto exit;
    }

    if( mode == MODE_ENCRYPT )
    {
        /*
         * Generate the initialization vector as:
         * IV = SHA-256( filesize || filename )[0..15]
         */
        for( i = 0; i < 8; i++ )
            buffer[i] = (unsigned char)( filesize >> ( i << 3 ) );

        p = argv[2];

        mbedtls_md_starts( &sha_ctx );
        mbedtls_md_update( &sha_ctx, buffer, 8 );
        mbedtls_md_update( &sha_ctx, (unsigned char *) p, strlen( p ) );
        mbedtls_md_finish( &sha_ctx, digest );

        memcpy( IV, digest, 16 );

        /*
         * The last four bits in the IV are actually used
         * to store the file size modulo the AES block size.
         */
        lastn = (int)( filesize & 0x0F );

        IV[15] = (unsigned char)
            ( ( IV[15] & 0xF0 ) | lastn );

        /*
         * Append the IV at the beginning of the output.
         */
        if( fwrite( IV, 1, 16, fout ) != 16 )
        {
            mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", 16 );
            goto exit;
        }

        /*
         * Hash the IV and the secret key together 8192 times
         * using the result to setup the AES context and HMAC.
         */
        memset( digest, 0,  32 );
        memcpy( digest, IV, 16 );

        for( i = 0; i < 8192; i++ )
        {
            mbedtls_md_starts( &sha_ctx );
            mbedtls_md_update( &sha_ctx, digest, 32 );
            mbedtls_md_update( &sha_ctx, key, keylen );
            mbedtls_md_finish( &sha_ctx, digest );
        }

        mbedtls_aes_setkey_enc( &aes_ctx, digest, 256 );
        mbedtls_md_hmac_starts( &sha_ctx, digest, 32 );

        /*
         * Encrypt and write the ciphertext.
         */
        for( offset = 0; offset < filesize; offset += 16 )
        {
            n = ( filesize - offset > 16 ) ? 16 : (int)
                ( filesize - offset );

            if( fread( buffer, 1, n, fin ) != (size_t) n )
            {
                mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", n );
                goto exit;
            }

            for( i = 0; i < 16; i++ )
                buffer[i] = (unsigned char)( buffer[i] ^ IV[i] );

            mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_ENCRYPT, buffer, buffer );
            mbedtls_md_hmac_update( &sha_ctx, buffer, 16 );

            if( fwrite( buffer, 1, 16, fout ) != 16 )
            {
                mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", 16 );
                goto exit;
            }

            memcpy( IV, buffer, 16 );
        }

        /*
         * Finally write the HMAC.
         */
        mbedtls_md_hmac_finish( &sha_ctx, digest );

        if( fwrite( digest, 1, 32, fout ) != 32 )
        {
            mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", 16 );
            goto exit;
        }
    }

    if( mode == MODE_DECRYPT )
    {
        /*
         *  The encrypted file must be structured as follows:
         *
         *        00 .. 15              Initialization Vector
         *        16 .. 31              AES Encrypted Block #1
         *           ..
         *      N*16 .. (N+1)*16 - 1    AES Encrypted Block #N
         *  (N+1)*16 .. (N+1)*16 + 32   HMAC-SHA-256(ciphertext)
         */
        if( filesize < 48 )
        {
            mbedtls_fprintf( stderr, "File too short to be encrypted.\n" );
            goto exit;
        }

        if( ( filesize & 0x0F ) != 0 )
        {
            mbedtls_fprintf( stderr, "File size not a multiple of 16.\n" );
            goto exit;
        }

        /*
         * Subtract the IV + HMAC length.
         */
        filesize -= ( 16 + 32 );

        /*
         * Read the IV and original filesize modulo 16.
         */
        if( fread( buffer, 1, 16, fin ) != 16 )
        {
            mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", 16 );
            goto exit;
        }

        memcpy( IV, buffer, 16 );
        lastn = IV[15] & 0x0F;

        /*
         * Hash the IV and the secret key together 8192 times
         * using the result to setup the AES context and HMAC.
         */
        memset( digest, 0,  32 );
        memcpy( digest, IV, 16 );

        for( i = 0; i < 8192; i++ )
        {
            mbedtls_md_starts( &sha_ctx );
            mbedtls_md_update( &sha_ctx, digest, 32 );
            mbedtls_md_update( &sha_ctx, key, keylen );
            mbedtls_md_finish( &sha_ctx, digest );
        }

        mbedtls_aes_setkey_dec( &aes_ctx, digest, 256 );
        mbedtls_md_hmac_starts( &sha_ctx, digest, 32 );

        /*
         * Decrypt and write the plaintext.
         */
        for( offset = 0; offset < filesize; offset += 16 )
        {
            if( fread( buffer, 1, 16, fin ) != 16 )
            {
                mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", 16 );
                goto exit;
            }

            memcpy( tmp, buffer, 16 );

            mbedtls_md_hmac_update( &sha_ctx, buffer, 16 );
            mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_DECRYPT, buffer, buffer );

            for( i = 0; i < 16; i++ )
                buffer[i] = (unsigned char)( buffer[i] ^ IV[i] );

            memcpy( IV, tmp, 16 );

            n = ( lastn > 0 && offset == filesize - 16 )
                ? lastn : 16;

            if( fwrite( buffer, 1, n, fout ) != (size_t) n )
            {
                mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", n );
                goto exit;
            }
        }

        /*
         * Verify the message authentication code.
         */
        mbedtls_md_hmac_finish( &sha_ctx, digest );

        if( fread( buffer, 1, 32, fin ) != 32 )
        {
            mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", 32 );
            goto exit;
        }

        /* Use constant-time buffer comparison */
        diff = 0;
        for( i = 0; i < 32; i++ )
            diff |= digest[i] ^ buffer[i];

        if( diff != 0 )
        {
            mbedtls_fprintf( stderr, "HMAC check failed: wrong key, "
                             "or file corrupted.\n" );
            goto exit;
        }
    }

    ret = 0;

exit:
    if( fin )
        fclose( fin );
    if( fout )
        fclose( fout );

    /* Zeroize all command line arguments to also cover
       the case when the user has missed or reordered some,
       in which case the key might not be in argv[4]. */
    for( i = 0; i < (unsigned int) argc; i++ )
        memset( argv[i], 0, strlen( argv[i] ) );

    memset( IV,     0, sizeof( IV ) );
    memset( key,    0, sizeof( key ) );
    memset( tmp,    0, sizeof( tmp ) );
    memset( buffer, 0, sizeof( buffer ) );
    memset( digest, 0, sizeof( digest ) );

    mbedtls_aes_free( &aes_ctx );
    mbedtls_md_free( &sha_ctx );

    return( ret );
}